

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegion * memory_map_aarch64(uc_struct_conflict2 *uc,hwaddr begin,size_t size,uint32_t perms)

{
  MemoryRegion *ram;
  uint32_t perms_local;
  size_t size_local;
  hwaddr begin_local;
  uc_struct_conflict2 *uc_local;
  
  uc_local = (uc_struct_conflict2 *)g_malloc_n(1,0xa0);
  memory_region_init_ram_aarch64(uc,(MemoryRegion *)uc_local,size,perms);
  if (((uc_local->address_space_memory).uc == (uc_struct_conflict12 *)0xffffffffffffffff) ||
     (*(RAMBlock **)&uc_local->errnum == (RAMBlock *)0x0)) {
    g_free(uc_local);
    uc_local = (uc_struct_conflict2 *)0x0;
  }
  else {
    memory_region_add_subregion_overlap_aarch64
              (uc->system_memory,begin,(MemoryRegion *)uc_local,uc->snapshot_level);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_aarch64(uc->cpu);
    }
  }
  return (MemoryRegion *)uc_local;
}

Assistant:

MemoryRegion *memory_map(struct uc_struct *uc, hwaddr begin, size_t size, uint32_t perms)
{
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    memory_region_init_ram(uc, ram, size, perms);
    if (ram->addr == -1 || !ram->ram_block) {
        // out of memory
        g_free(ram);
        return NULL;
    }

    memory_region_add_subregion_overlap(uc->system_memory, begin, ram, uc->snapshot_level);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    return ram;
}